

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lss_allocator.cc
# Opt level: O3

void * __thiscall
FASTER::core::lss_memory::ThreadAllocator::AllocateAligned
          (ThreadAllocator *this,uint32_t size,uint32_t alignment)

{
  uint8_t *puVar1;
  uint uVar2;
  SegmentAllocator *this_00;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint32_t allocations;
  uint uVar6;
  uint uVar7;
  
  uVar3 = alignment - (alignment >> 1 & 0x55555555);
  uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
  uVar6 = size + alignment + 1;
  uVar7 = uVar6 & 0xfffffff0;
  this_00 = this->segment_allocator_;
  while( true ) {
    if (this_00 == (SegmentAllocator *)0x0) {
      this_00 = (SegmentAllocator *)aligned_alloc(0x40,0x1f50);
      this->segment_allocator_ = this_00;
      if (this_00 == (SegmentAllocator *)0x0) {
        return (void *)0x0;
      }
      (this_00->state).field_0 = (anon_union_8_2_79a71db5_for_SegmentState_0)0x0;
    }
    if (alignment < 0x10) {
      __assert_fail("alignment >= kBaseAlignment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/lss_allocator.cc"
                    ,0x69,
                    "void *FASTER::core::lss_memory::ThreadAllocator::AllocateAligned(uint32_t, uint32_t)"
                   );
    }
    if (1 < ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18) {
      __assert_fail("(alignment & (alignment - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/lss_allocator.cc"
                    ,0x6a,
                    "void *FASTER::core::lss_memory::ThreadAllocator::AllocateAligned(uint32_t, uint32_t)"
                   );
    }
    if (8000 < uVar7) break;
    uVar2 = this->segment_offset_;
    allocations = this->allocations_ + 1;
    this->allocations_ = allocations;
    if (8000 < uVar2) {
      __assert_fail("result <= kSegmentSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/lss_allocator.h"
                    ,0xb4,"uint32_t FASTER::core::lss_memory::ThreadAllocator::Reserve(uint32_t)");
    }
    uVar4 = uVar2 + uVar7;
    this->segment_offset_ = uVar4;
    if (uVar4 < 0x1f41) {
      if ((alignment & alignment - 1) != 0) {
        __assert_fail("(alignment & (alignment - 1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/auto_ptr.h"
                      ,0x31,"size_t FASTER::core::pad_alignment(size_t, size_t)");
      }
      iVar5 = (int)this_00->buffer + uVar2;
      uVar3 = ((-alignment & alignment + iVar5 + 1) - iVar5) - 2;
      if ((ulong)size + (ulong)uVar3 + 2 <= (ulong)(uVar6 & 0xfffffff0)) {
        uVar3 = uVar3 + uVar2;
        puVar1 = this_00->buffer + uVar3;
        *(short *)puVar1 = (short)uVar3;
        return puVar1 + 2;
      }
      __assert_fail("user_offset + sizeof(Header) + size <= block_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/lss_allocator.cc"
                    ,0x7c,
                    "void *FASTER::core::lss_memory::ThreadAllocator::AllocateAligned(uint32_t, uint32_t)"
                   );
    }
    SegmentAllocator::Seal(this_00,allocations);
    this->segment_allocator_ = (SegmentAllocator *)0x0;
    this->segment_offset_ = 0;
    this->allocations_ = 0;
    this_00 = (SegmentAllocator *)0x0;
  }
  __assert_fail("block_size <= kSegmentSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/lss_allocator.h"
                ,0xb1,"uint32_t FASTER::core::lss_memory::ThreadAllocator::Reserve(uint32_t)");
}

Assistant:

void* ThreadAllocator::AllocateAligned(uint32_t size, uint32_t alignment) {
  if(!segment_allocator_) {
    segment_allocator_ = reinterpret_cast<SegmentAllocator*>(aligned_alloc(kCacheLineSize,
                         sizeof(SegmentAllocator)));
    if(!segment_allocator_) {
      return nullptr;
    }
    new(segment_allocator_) SegmentAllocator{};
  }
  // Alignment must be >= base alignment, and a power of 2.
  assert(alignment >= kBaseAlignment);
  assert((alignment & (alignment - 1)) == 0);
  // Block needs to be large enough to hold the user block, the header, and the align land fill.
  // Max align land fill size is (alignment - kBaseAlignment).
  uint32_t block_size = static_cast<uint32_t>(pad_alignment(
                          size + sizeof(Header) + alignment - kBaseAlignment,
                          kBaseAlignment));
  uint32_t block_offset = Reserve(block_size);
  if(segment_offset_ <= kSegmentSize) {
    // The allocation succeeded inside the active segment.
    uint8_t* buffer = segment_allocator_->buffer;
#ifdef _DEBUG
    //  - 0xEA - align land fill.
    ::memset(&buffer[block_offset], 0xEA, block_size);
#endif
    // Align the user block.
    uint32_t user_offset = static_cast<uint32_t>(pad_alignment(reinterpret_cast<size_t>(
                             &buffer[block_offset]) + sizeof(Header), alignment) -
                           reinterpret_cast<size_t>(&buffer[block_offset]) - sizeof(Header));
    assert(user_offset + sizeof(Header) + size <= block_size);
    uint32_t offset = block_offset + user_offset;
#ifdef _DEBUG
    //  - 0xCA - allocated.
    ::memset(&buffer[offset], 0xCA, size + sizeof(Header));
#endif
    Header* header = reinterpret_cast<Header*>(&buffer[offset]);
#ifdef _DEBUG
    new(header) Header(size, offset);
#else
    new(header) Header(offset);
#endif
    return header + 1;
  } else {
    // We filled the active segment; seal it.
    segment_allocator_->Seal(allocations_);
    segment_allocator_ = nullptr;
    allocations_ = 0;
    segment_offset_ = 0;
    // Call self recursively, to allocate inside a new segment.
    return AllocateAligned(size, alignment);
  }
}